

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O0

int anon_unknown.dwarf_1e83b::ChannelOut_aftertouch(lua_State *L)

{
  int iVar1;
  ChannelOut *this;
  long xs_1;
  long xs_1_00;
  lua_Integer pitch;
  lua_Integer pressure;
  ChannelOut *self;
  lua_State *L_local;
  
  this = getChannelOut(L,1);
  xs_1 = luaL_checkinteger(L,2);
  if ((xs_1 < 0) || (0x7f < xs_1)) {
    luaL_argerror(L,2,"Aftertouch pressure must be between 0 and 127");
  }
  iVar1 = lua_type(L,3);
  if (iVar1 < 1) {
    ChannelOut::send<int,long>(this,this->index + 0xd0,xs_1);
  }
  else {
    xs_1_00 = luaL_checkinteger(L,3);
    if ((xs_1_00 < 0) || (0x7f < xs_1_00)) {
      luaL_argerror(L,3,"Pitch must be between 0 and 127");
    }
    ChannelOut::send<int,long,long>(this,this->index + 0xa0,xs_1_00,xs_1);
  }
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_aftertouch(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer pressure = luaL_checkinteger(L, 2);

	luaL_argcheck(L, pressure >= 0 && pressure <= 0x7F, 2, "Aftertouch pressure must be between 0 and 127");

	if (!lua_isnoneornil(L, 3)) {
		lua_Integer pitch = luaL_checkinteger(L, 3);
		luaL_argcheck(L, pitch >= 0 && pitch <= 0x7F, 3, "Pitch must be between 0 and 127");
		self.send(0xA0 + self.index, pitch, pressure);
	}
	else
		self.send(0xD0 + self.index, pressure);

	lua_settop(L, 1);
	return 1;
}